

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_file.c
# Opt level: O1

FFSRecordType next_record_type(FFSFile ffsfile)

{
  long lVar1;
  _FFSIndexElement *p_Var2;
  uint uVar3;
  bool bVar4;
  int64_t size;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  FFSBuffer p_Var9;
  FFSTypeHandle_conflict p_Var10;
  FFSRecordType FVar11;
  long lVar12;
  size_t sVar13;
  long lVar14;
  FFSIndexItem p_Var15;
  int tmp_value;
  char *local_a0;
  int local_94;
  uint local_78 [18];
  
  while( true ) {
    if (ffsfile->status != OpenForRead) {
      return FFSerror;
    }
    if (ffsfile->tmp_buffer == (FFSBuffer)0x0) {
      p_Var9 = create_FFSBuffer();
      ffsfile->tmp_buffer = p_Var9;
    }
    if (ffsfile->read_ahead != 0) goto LAB_00117979;
    iVar5 = (*ffsfile->read_func)(ffsfile->file_id,local_78,4,(int *)0x0,(char **)0x0);
    if (iVar5 != 4) goto LAB_0011788e;
    uVar6 = local_78[0] >> 0x18 | (local_78[0] & 0xff0000) >> 8;
    uVar3 = uVar6 | (local_78[0] & 0xff00) << 8;
    iVar5 = (int)(uVar3 | local_78[0] << 0x18) >> 0x18;
    if (iVar5 != 3) break;
    ffsfile->next_record_type = FFSdata;
    iVar5 = (*ffsfile->read_func)(ffsfile->file_id,local_78,4,(int *)0x0,(char **)0x0);
    if (iVar5 != 4) {
LAB_0011788e:
      FVar11 = (ffsfile->errno_val == 0) + FFSerror;
      ffsfile->next_record_type = FVar11;
      return FVar11;
    }
    size = CONCAT44(uVar6,local_78[0] >> 0x18 | (local_78[0] & 0xff0000) >> 8 |
                          (local_78[0] & 0xff00) << 8 | local_78[0] << 0x18);
    ffsfile->next_data_len = size;
    make_tmp_buffer(ffsfile->tmp_buffer,size);
    local_a0 = (char *)ffsfile->tmp_buffer->tmp_buffer;
    iVar5 = (*ffsfile->read_func)(ffsfile->file_id,local_a0,8,(int *)0x0,(char **)0x0);
    if (iVar5 != 8) goto LAB_0011788e;
    iVar5 = FMformatID_len(local_a0);
    ffsfile->next_fid_len = iVar5;
    if ((8 < iVar5) &&
       (uVar6 = (*ffsfile->read_func)
                          (ffsfile->file_id,local_a0 + 8,(ulong)(iVar5 - 8U),(int *)0x0,(char **)0x0
                          ), uVar6 != iVar5 - 8U)) {
      FVar11 = (ffsfile->errno_val == 0) + FFSerror;
      ffsfile->next_record_type = FVar11;
      return FVar11;
    }
    p_Var10 = FFSTypeHandle_from_encode(ffsfile->c,local_a0);
    ffsfile->next_actual_handle = p_Var10;
    if ((p_Var10 == (FFSTypeHandle_conflict)0x0) && (ffsfile->index_head != (FFSIndexItem)0x0)) {
      iVar7 = (*ffs_file_lseek_func)(ffsfile->file_id,0,1);
      iVar5 = ffsfile->next_fid_len;
      memcpy(local_78,local_a0,(long)iVar5);
      p_Var15 = ffsfile->index_head;
      if (p_Var15 != (FFSIndexItem)0x0) {
        lVar1 = ffsfile->next_data_len;
        local_94 = 0;
        do {
          if (0 < p_Var15->elem_count) {
            lVar12 = 0x18;
            lVar14 = 0;
            do {
              p_Var2 = p_Var15->elements;
              bVar4 = true;
              if ((((*(int *)((long)p_Var2 + lVar12 + -0x18) == 8) &&
                   (*(int *)((long)&p_Var2->type + lVar12) == ffsfile->next_fid_len)) &&
                  (iVar8 = bcmp(*(void **)((long)p_Var2 + lVar12 + -8),local_a0,
                                (long)ffsfile->next_fid_len), iVar8 == 0)) &&
                 (iVar8 = (*ffs_file_lseek_func)
                                    (ffsfile->file_id,*(size_t *)((long)p_Var2 + lVar12 + -0x10),0),
                 iVar8 != -1)) {
                ffsfile->read_ahead = 0;
                FFSread_format(ffsfile);
                bVar4 = false;
                (*ffs_file_lseek_func)(ffsfile->file_id,(long)iVar7,0);
                ffsfile->read_ahead = 1;
                ffsfile->next_record_type = FFSdata;
                local_a0 = (char *)ffsfile->tmp_buffer->tmp_buffer;
                memcpy(local_a0,local_78,(long)iVar5);
                ffsfile->next_data_len = lVar1;
                p_Var10 = FFSTypeHandle_from_encode(ffsfile->c,local_a0);
                ffsfile->next_actual_handle = p_Var10;
                local_94 = local_94 + 1;
              }
              if (!bVar4) break;
              lVar14 = lVar14 + 1;
              lVar12 = lVar12 + 0x28;
            } while (lVar14 < p_Var15->elem_count);
          }
        } while ((local_94 == 0) && (p_Var15 = p_Var15->next, p_Var15 != (_FFSIndexItem *)0x0));
      }
    }
    p_Var10 = FFS_target_from_encode(ffsfile->c,local_a0);
    ffsfile->next_data_handle = p_Var10;
    if ((p_Var10 != (FFSTypeHandle_conflict)0x0) || (ffsfile->raw_flag != 0)) {
      iVar7 = FFSheader_size(ffsfile->next_actual_handle);
      iVar5 = ffsfile->next_fid_len;
      if ((iVar5 < iVar7) &&
         (iVar8 = (*ffsfile->read_func)
                            (ffsfile->file_id,local_a0 + iVar5,(long)(iVar7 - iVar5),(int *)0x0,
                             (char **)0x0), iVar8 != iVar7 - iVar5)) {
        FVar11 = (ffsfile->errno_val == 0) + FFSerror;
        ffsfile->next_record_type = FVar11;
        return FVar11;
      }
      ffsfile->data_block_no = ffsfile->data_block_no + 1;
      goto LAB_00117972;
    }
    sVar13 = ffsfile->next_data_len - (long)ffsfile->next_fid_len;
    iVar5 = (*ffsfile->read_func)
                      (ffsfile->file_id,local_a0 + ffsfile->next_fid_len,sVar13,(int *)0x0,
                       (char **)0x0);
    if (sVar13 != (long)iVar5) {
      FVar11 = (ffsfile->errno_val == 0) + FFSerror;
      ffsfile->next_record_type = FVar11;
      return FVar11;
    }
    ffsfile->read_ahead = 0;
  }
  if (iVar5 == 4) {
    ffsfile->next_record_type = FFSindex;
  }
  else {
    if (iVar5 == 2) {
      ffsfile->next_record_type = FFSformat;
      ffsfile->next_fid_len = uVar3;
      iVar5 = (*ffsfile->read_func)(ffsfile->file_id,local_78,4,(int *)0x0,(char **)0x0);
      if (iVar5 != 4) {
        FVar11 = (ffsfile->errno_val == 0) + FFSerror;
        ffsfile->next_record_type = FVar11;
        return FVar11;
      }
      ffsfile->next_data_len =
           (ulong)(local_78[0] >> 0x18 | (local_78[0] & 0xff0000) >> 8 | (local_78[0] & 0xff00) << 8
                  | local_78[0] << 0x18);
      goto LAB_00117972;
    }
    if (iVar5 != 1) {
      puts("CORRUPT FFSFILE");
      exit(1);
    }
    ffsfile->next_record_type = FFScomment;
  }
  ffsfile->next_data_len = (ulong)uVar3;
LAB_00117972:
  ffsfile->read_ahead = 1;
LAB_00117979:
  return ffsfile->next_record_type;
}

Assistant:

static
FFSRecordType
next_record_type(FFSFile ffsfile)
{
    FILE_INT indicator_chunk = 0;
 restart:
    if (ffsfile->status != OpenForRead) {
	return FFSerror;
    }
    if (ffsfile->tmp_buffer == NULL) {
	ffsfile->tmp_buffer = create_FFSBuffer();
    }
    if (ffsfile->read_ahead == FALSE) {
	if (!get_AtomicInt(ffsfile, &indicator_chunk)) {
	    ffsfile->next_record_type = 
		(ffsfile->errno_val) ? FFSerror : FFSend;
	    return ffsfile->next_record_type;
	}
	
	indicator_chunk = ntohl(indicator_chunk);
	switch (indicator_chunk >> 24) {
	case 0x1: /* comment */
		ffsfile->next_record_type = FFScomment;
		ffsfile->next_data_len = indicator_chunk & 0xffffff;
		break;
	case 0x2: /* format */
		ffsfile->next_record_type = FFSformat;
		ffsfile->next_fid_len = indicator_chunk & 0xffffff;
		if (!get_AtomicInt(ffsfile, &indicator_chunk)) {
		    ffsfile->next_record_type = (ffsfile->errno_val) ? FFSerror : FFSend;
		    return ffsfile->next_record_type;
		}
		ffsfile->next_data_len = ntohl(indicator_chunk);
		break;
	case 0x3: /* data */ {
		char *tmp_buf;
		int header_size;
		DATA_LEN_TYPE top_data_len_bytes;
		ffsfile->next_record_type = FFSdata;
		top_data_len_bytes = (indicator_chunk & 0xffff);
		if (!get_AtomicInt(ffsfile, &indicator_chunk)) {
		    ffsfile->next_record_type = (ffsfile->errno_val) ? FFSerror : FFSend;
		    return ffsfile->next_record_type;
		}
		ffsfile->next_data_len = ntohl(indicator_chunk) + 
		    (top_data_len_bytes << 32);
		make_tmp_buffer(ffsfile->tmp_buffer, ffsfile->next_data_len);
		tmp_buf = ffsfile->tmp_buffer->tmp_buffer;
		/* first get format ID, at least 8 bytes */
		if (ffsfile->read_func(ffsfile->file_id, tmp_buf, 8, NULL,
                                       NULL) != 8) {
		    ffsfile->next_record_type = (ffsfile->errno_val) ?
                        FFSerror : FFSend;
		    return ffsfile->next_record_type;
		}
		ffsfile->next_fid_len = FMformatID_len(tmp_buf);
		if (ffsfile->next_fid_len > 8) {
		    int more = ffsfile->next_fid_len - 8;
		    if (ffsfile->read_func(ffsfile->file_id, tmp_buf + 8,
                                           more, NULL, NULL) != more) {
			ffsfile->next_record_type = (ffsfile->errno_val) ?
                            FFSerror : FFSend;
			return ffsfile->next_record_type;
		    }
		}

		ffsfile->next_actual_handle = 
		    FFSTypeHandle_from_encode(ffsfile->c, tmp_buf);

                if (!ffsfile->next_actual_handle && ffsfile->index_head) {

                    struct _FFSIndexItem *index = NULL;
                    off_t fpos_bak = ffs_file_lseek_func(ffsfile->file_id, 0, SEEK_CUR);
		    int fid_len = ffsfile->next_fid_len;
		    char tmp_fid_storage[64];
		    size_t tmp_data_len;
		    int done = 0;
		    assert(sizeof(tmp_fid_storage) > fid_len);
		    /* store away the format ID we've read */
		    memcpy(tmp_fid_storage, tmp_buf, fid_len);
		    tmp_data_len = ffsfile->next_data_len;

                    index = ffsfile->index_head;
                    while (!done && index) {
			int i;
			for (i=0 ; i < index->elem_count; i++) {
			    struct _FFSIndexElement *elem;
			    elem = &index->elements[i];
			    if (elem->type == FFSformat &&
				elem->fid_len == ffsfile->next_fid_len &&
				!(memcmp(elem->format_id,
					 tmp_buf, ffsfile->next_fid_len))) {

				if (ffs_file_lseek_func(ffsfile->file_id, elem->fpos, SEEK_SET) != -1) {
				    ffsfile->read_ahead = FALSE;
				    FFSread_format(ffsfile);
				    ffs_file_lseek_func(ffsfile->file_id, fpos_bak, SEEK_SET);
				    ffsfile->read_ahead = TRUE;
				    ffsfile->next_record_type = FFSdata;
				    /* tmp_buf might have changed */
				    tmp_buf = ffsfile->tmp_buffer->tmp_buffer;
				    /* put back the format ID we read earlier */
				    memcpy(tmp_buf, tmp_fid_storage, fid_len);
				    ffsfile->next_data_len = tmp_data_len;

				    ffsfile->next_actual_handle = 
					FFSTypeHandle_from_encode(ffsfile->c,
								  tmp_buf);
				    done++;
				    break;
				}
			    }
                        }

                        index = index->next;
                    }
                }
		/* GSE
		 * If ffsfile->next_actual_handle is NULL here, we have 
		 * a problem.  The only way this should happen is if we 
		 * have used FFSset_fpos() to seek forward in a file, 
		 * skipping over the Format record associated with this
		 * data item.  But now we NEED IT.  We must :
		 *  1) Save our current FPOS
		 *  2) find the format in the index
		 *  3) lseek the its location (set read_ahead to false)
		 *  4) read the format
		 *  5) lseek back to our saved FPOS
		 *  6) call FFSTypeHandle_from_encode() again to set
		 *     next_actual_handle correctly.
		 */
		ffsfile->next_data_handle = 
		    FFS_target_from_encode(ffsfile->c, tmp_buf);

		if ((ffsfile->next_data_handle == NULL) &&
                    (!ffsfile->raw_flag)) {
		    /* no target for this format, discard */
		    size_t more = ffsfile->next_data_len - ffsfile->next_fid_len;
		    if (ffsfile->read_func(ffsfile->file_id, tmp_buf +
                                           ffsfile->next_fid_len, more, NULL,
                                           NULL) != more) {
			ffsfile->next_record_type = (ffsfile->errno_val) ?
                            FFSerror : FFSend;
			return ffsfile->next_record_type;
		    }
		    ffsfile->read_ahead = FALSE;
		    goto restart;
		    
		}
		header_size = FFSheader_size(ffsfile->next_actual_handle);
		if (header_size > ffsfile->next_fid_len) {
		    int more = header_size - ffsfile->next_fid_len;
		    if (ffsfile->read_func(ffsfile->file_id, tmp_buf +
                                           ffsfile->next_fid_len, more, NULL,
                                           NULL) != more) {
			ffsfile->next_record_type = (ffsfile->errno_val) ?
                            FFSerror : FFSend;
			return ffsfile->next_record_type;
		    }
		}
                ffsfile->data_block_no++;
		break;
	case 0x4: /* index */
		ffsfile->next_record_type = FFSindex;
		ffsfile->next_data_len = indicator_chunk & 0xffffff;
/*		if (!ffsfile->expose_index) {
		    ffs_file_lseek_func((int)(intptr_t)ffsfile->file_id, INDEX_BLOCK_SIZE-4, SEEK_CUR);
		    ffsfile->read_ahead = FALSE;
		    return next_record_type(ffsfile);
		    }*/
		break;
	default:
	    printf("CORRUPT FFSFILE\n");
	    exit(1);
	}
	}
	ffsfile->read_ahead = TRUE;
    }
    return ffsfile->next_record_type;
}